

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
Vector3<ExactFloat>::Vector3(Vector3<ExactFloat> *this,ExactFloat *x,ExactFloat *y,ExactFloat *z)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    ExactFloat::ExactFloat((ExactFloat *)((long)&this->c_[0].sign_ + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  ExactFloat::operator=(this->c_,x);
  ExactFloat::operator=(this->c_ + 1,y);
  ExactFloat::operator=(this->c_ + 2,z);
  return;
}

Assistant:

Vector3(T x, T y, T z) {
    c_[0] = x;
    c_[1] = y;
    c_[2] = z;
  }